

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void DC8uv_C(uint8_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = dst + -0x20;
  uVar1 = 8;
  lVar3 = -1;
  do {
    uVar1 = (uint)dst[lVar3] + *pbVar2 + uVar1;
    pbVar2 = pbVar2 + 1;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xff);
  lVar3 = 0;
  do {
    *(ulong *)(dst + lVar3) = (ulong)(uVar1 >> 4 & 0xff) * 0x101010101010101;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

static void DC8uv_C(uint8_t* dst) {     // DC
  int dc0 = 8;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[i - BPS] + dst[-1 + i * BPS];
  }
  Put8x8uv(dc0 >> 4, dst);
}